

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_msg_generator.c
# Opt level: O0

rfc5444_result
rfc5444_writer_create_message
          (rfc5444_writer *writer,uint8_t msgid,uint8_t addr_len,rfc5444_writer_targetselector useIf
          ,void *param)

{
  list_entity *plVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  _Bool _Var5;
  rfc5444_result rVar6;
  int iVar7;
  ulong uVar8;
  rfc5444_writer_address **pprVar9;
  bool bVar10;
  rfc5444_writer_message *local_478;
  int count;
  int size;
  list_entity *__tempptr_22;
  list_entity *__tempptr_21;
  list_entity *__tempptr_20;
  list_entity *__tempptr_19;
  list_entity *__tempptr_18;
  list_entity *__tempptr_17;
  list_entity *__tempptr_16;
  list_entity *__tempptr_15;
  list_entity *__tempptr_14;
  list_entity *__tempptr_13;
  list_entity *__tempptr_12;
  list_entity *__tempptr_11;
  list_entity *__tempptr_10;
  list_entity *__tempptr_9;
  list_entity *__tempptr_8;
  size_t interface_msg_mtu;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  size_t sStack_2e0;
  rfc5444_result result;
  size_t max_msg_size;
  int local_2d0;
  _Bool not_fragmented;
  int iStack_2cc;
  _Bool first;
  int non_mandatory;
  int idx;
  int i;
  int same_prefixlen;
  int best_head;
  int best_size;
  _rfc5444_internal_addr_compress_session acs [16];
  long local_130;
  size_t processor_preallocation;
  rfc5444_writer_postprocessor *processor;
  list_entity current_list;
  rfc5444_writer_target *target;
  rfc5444_writer_tlvtype *tlvtype;
  rfc5444_writer_address *last_processed;
  rfc5444_writer_address *first_processed;
  rfc5444_writer_address *first_addr;
  rfc5444_writer_address *addr;
  list_entity *ptr1;
  rfc5444_writer_content_provider *prv;
  rfc5444_writer_message *msg;
  void *param_local;
  rfc5444_writer_targetselector useIf_local;
  uint8_t addr_len_local;
  rfc5444_writer *prStack_b0;
  uint8_t msgid_local;
  rfc5444_writer *writer_local;
  list_entity *local_a0;
  list_entity *local_98;
  undefined8 local_90;
  rfc5444_writer_message *local_88;
  list_entity *local_80;
  list_entity *local_78;
  list_entity *local_70;
  list_entity *local_68;
  rfc5444_writer_postprocessor *local_60;
  rfc5444_writer_postprocessor *local_58;
  list_entity *local_50;
  list_entity *local_48;
  uint8_t *local_40;
  list_entity *local_38;
  list_entity *local_30;
  list_entity *local_28;
  list_entity *local_20;
  list_entity *local_18;
  uint8_t *local_10;
  
  useIf_local._6_1_ = addr_len;
  useIf_local._7_1_ = msgid;
  prStack_b0 = writer;
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_msg_generator.c"
                  ,0x86,
                  "enum rfc5444_result rfc5444_writer_create_message(struct rfc5444_writer *, uint8_t, uint8_t, rfc5444_writer_targetselector, void *)"
                 );
  }
  local_98 = &writer->_targets;
  bVar10 = false;
  if (local_98->next == local_98) {
    bVar10 = (writer->_targets).prev == local_98;
  }
  if (bVar10) {
    writer_local._4_4_ = RFC5444_OKAY;
  }
  else {
    local_88 = (rfc5444_writer_message *)
               avl_find(&writer->_msgcreators,(void *)((long)&useIf_local + 7));
    local_90 = 0;
    local_478 = local_88;
    if (local_88 == (rfc5444_writer_message *)0x0) {
      local_478 = (rfc5444_writer_message *)0x0;
    }
    if (local_478 == (rfc5444_writer_message *)0x0) {
      writer_local._4_4_ = RFC5444_NO_MSGCREATOR;
    }
    else {
      if ((local_478->target_specific & 1U) == 0) {
        prStack_b0->msg_target = (rfc5444_writer_target *)0x0;
      }
      else {
        if (useIf != rfc5444_writer_singletarget_selector) {
          plVar1 = (prStack_b0->_targets).next;
          while( true ) {
            current_list.prev = plVar1 + -3;
            if (plVar1->prev == (prStack_b0->_targets).prev) {
              return RFC5444_OKAY;
            }
            _Var5 = (*useIf)(prStack_b0,(rfc5444_writer_target *)current_list.prev,param);
            if ((_Var5) &&
               (rVar6 = rfc5444_writer_create_message
                                  (prStack_b0,useIf_local._7_1_,useIf_local._6_1_,
                                   rfc5444_writer_singletarget_selector,current_list.prev),
               rVar6 != RFC5444_OKAY)) break;
            plVar1 = current_list.prev[3].next;
          }
          return rVar6;
        }
        prStack_b0->msg_target = (rfc5444_writer_target *)param;
      }
      prStack_b0->msg_addr_len = useIf_local._6_1_;
      local_130 = 0;
      for (processor_preallocation = (size_t)(prStack_b0->_processors).list_head.next;
          *(list_entity **)(processor_preallocation + 8) != (prStack_b0->_processors).list_head.prev
          ; processor_preallocation = *(size_t *)processor_preallocation) {
        uVar8 = (**(code **)(processor_preallocation + 0x40))
                          (processor_preallocation,local_478->type);
        if ((uVar8 & 1) != 0) {
          local_130 = (ulong)*(ushort *)(processor_preallocation + 0x3c) + local_130;
        }
      }
      sStack_2e0 = prStack_b0->msg_size;
      plVar1 = (prStack_b0->_targets).next;
      while (current_list.prev = plVar1 + -3, plVar1->prev != (prStack_b0->_targets).prev) {
        _Var5 = (*useIf)(prStack_b0,(rfc5444_writer_target *)current_list.prev,param);
        if (_Var5) {
          if (((ulong)current_list.prev[4].next & 1) != 0) {
            _rfc5444_writer_begin_packet(prStack_b0,(rfc5444_writer_target *)current_list.prev);
          }
          uVar8 = (long)(current_list.prev)->prev +
                  (-((long)&(current_list.prev[5].prev)->next +
                    (long)&(current_list.prev[5].next)->next +
                    (long)&(current_list.prev[6].next)->next) - local_130);
          if (uVar8 < sStack_2e0) {
            sStack_2e0 = uVar8;
          }
        }
        plVar1 = current_list.prev[3].next;
      }
      _rfc5444_tlv_writer_init(&prStack_b0->_msg,sStack_2e0,prStack_b0->msg_size);
      prStack_b0->_state = RFC5444_WRITER_ADD_HEADER;
      rfc5444_writer_set_msg_header(prStack_b0,local_478,false,false,false,false);
      if ((local_478->addMessageHeader ==
           (_func_int_rfc5444_writer_ptr_rfc5444_writer_message_ptr *)0x0) ||
         (iVar7 = (*local_478->addMessageHeader)(prStack_b0,local_478), iVar7 == 0)) {
        prStack_b0->_state = RFC5444_WRITER_ADD_MSGTLV;
        for (plVar1 = (local_478->_provider_tree).list_head.next;
            plVar1->prev != (local_478->_provider_tree).list_head.prev; plVar1 = plVar1->next) {
          if (plVar1[-2].prev != (list_entity *)0x0) {
            (*(code *)plVar1[-2].prev)(prStack_b0);
          }
        }
        prStack_b0->_state = RFC5444_WRITER_ADD_ADDRESSES;
        for (plVar1 = (local_478->_provider_tree).list_head.next;
            plVar1->prev != (local_478->_provider_tree).list_head.prev; plVar1 = plVar1->next) {
          if (plVar1[-1].next != (list_entity *)0x0) {
            (*(code *)plVar1[-1].next)(prStack_b0);
          }
        }
        local_78 = &local_478->_addr_head;
        local_80 = &local_478->_non_mandatory_addr_head;
        bVar10 = false;
        if (local_80->next == local_80) {
          bVar10 = (local_478->_non_mandatory_addr_head).prev == local_80;
        }
        if (!bVar10) {
          ((local_478->_addr_head).prev)->next = local_80->next;
          local_80->next->prev = (local_478->_addr_head).prev;
          (local_478->_addr_head).prev = (local_478->_non_mandatory_addr_head).prev;
          ((local_478->_non_mandatory_addr_head).prev)->next = local_78;
          (local_478->_non_mandatory_addr_head).prev = local_80;
          local_80->next = local_80;
          local_68 = local_80;
        }
        local_58 = (rfc5444_writer_postprocessor *)&processor;
        max_msg_size._6_1_ = true;
        local_a0 = &local_478->_addr_head;
        bVar10 = false;
        if (local_a0->next == local_a0) {
          bVar10 = (local_478->_addr_head).prev == local_a0;
        }
        local_70 = local_80;
        current_list.next = (list_entity *)local_58;
        processor = local_58;
        if (bVar10) {
          _finalize_message_fragment
                    (prStack_b0,local_478,(list_entity *)&processor,true,useIf,param);
          prStack_b0->_state = RFC5444_WRITER_NONE;
          _rfc5444_writer_free_addresses(prStack_b0,local_478);
          writer_local._4_4_ = RFC5444_OKAY;
        }
        else {
          bVar10 = true;
          idx = 0;
          last_processed = (rfc5444_writer_address *)0x0;
          tlvtype = (rfc5444_writer_tlvtype *)0x0;
          sVar2 = (prStack_b0->_msg).header;
          sVar3 = (prStack_b0->_msg).allocated;
          sVar4 = (prStack_b0->_msg).added;
          iStack_2cc = 0;
          local_2d0 = 0;
          addr = (rfc5444_writer_address *)(local_478->_addr_head).next;
          while (addr != (rfc5444_writer_address *)&local_478->_addr_head) {
            pprVar9 = &addr[-1]._block_end;
            if (((addr->_block_multiple_prefixlen & 1U) == 0) || ((addr->_block_headlen & 1) != 0))
            {
              if (bVar10) {
                for (plVar1 = (local_478->_msgspecific_tlvtype_head).next;
                    plVar1->prev != (local_478->_msgspecific_tlvtype_head).prev;
                    plVar1 = plVar1->next) {
                  memset((void *)((long)&plVar1[1].prev + 4),0,0x40);
                  memset((void *)((long)&plVar1[5].prev + 4),0,0x10);
                }
                for (plVar1 = (prStack_b0->_addr_tlvtype_head).next;
                    plVar1->prev != (prStack_b0->_addr_tlvtype_head).prev; plVar1 = plVar1->next) {
                  memset((void *)((long)&plVar1[1].prev + 4),0,0x40);
                  memset((void *)((long)&plVar1[5].prev + 4),0,0x10);
                }
                memset(&best_head,0,0x180);
                idx = 1;
                last_processed = (rfc5444_writer_address *)pprVar9;
              }
              *(int *)pprVar9 = iStack_2cc;
              local_50 = (list_entity *)((addr->address)._addr + 0xc);
              local_48 = (list_entity *)&processor;
              local_28 = current_list.next;
              local_50->next = local_48;
              (addr->_addr_list_node).next = current_list.next;
              (current_list.next)->next = local_50;
              local_38 = local_50;
              local_30 = local_48;
              current_list.next = local_50;
              idx = _compress_address((_rfc5444_internal_addr_compress_session *)&best_head,
                                      prStack_b0,(list_entity *)&processor,idx);
              bVar10 = false;
              i = -1;
              same_prefixlen = ((((int)sStack_2e0 - (int)sVar2) - (int)sVar3) - (int)sVar4) + 1;
              for (non_mandatory = 0; non_mandatory < (int)(uint)prStack_b0->msg_addr_len;
                  non_mandatory = non_mandatory + 1) {
                iVar7 = *(int *)&acs[non_mandatory].ptr +
                        *(int *)((long)&acs[non_mandatory].ptr + 4);
                if ((iVar7 < same_prefixlen) &&
                   (*(int *)pprVar9 - **(int **)(&best_head + (long)non_mandatory * 6) < 0xff)) {
                  i = non_mandatory;
                  same_prefixlen = iVar7;
                }
              }
              if (i == -1) {
                if (local_2d0 == 0) {
                  prStack_b0->_state = RFC5444_WRITER_NONE;
                  _rfc5444_writer_free_addresses(prStack_b0,local_478);
                  return RFC5444_MTU_TOO_SMALL;
                }
                max_msg_size._6_1_ = false;
                local_40 = (addr->address)._addr + 0xc;
                local_18 = (addr->_addr_list_node).next;
                local_20 = *(list_entity **)local_40;
                local_18->next = local_20;
                local_20->prev = local_18;
                (addr->_addr_list_node).next = (list_entity *)0x0;
                *(long *)local_40 = 0;
                local_10 = local_40;
                _close_addrblock((_rfc5444_internal_addr_compress_session *)&best_head,prStack_b0,
                                 (rfc5444_writer_address *)tlvtype,0);
                _finalize_message_fragment
                          (prStack_b0,local_478,(list_entity *)&processor,false,useIf,param);
                local_60 = (rfc5444_writer_postprocessor *)&processor;
                addr = (rfc5444_writer_address *)&last_processed->_addr_list_node;
                bVar10 = true;
                iStack_2cc = iStack_2cc + 1;
                current_list.next = (list_entity *)local_60;
                processor = local_60;
              }
              else {
                for (non_mandatory = 0; non_mandatory < (int)(uint)prStack_b0->msg_addr_len;
                    non_mandatory = non_mandatory + 1) {
                  *(int *)&acs[non_mandatory].ptr =
                       *(int *)((long)&acs[non_mandatory].ptr + 4) + *(int *)&acs[non_mandatory].ptr
                  ;
                }
                if (((addr->_block_multiple_prefixlen & 1U) == 0) &&
                   (addr->_block_multiple_prefixlen = true, (addr->_block_headlen & 1) == 0)) {
                  local_2d0 = local_2d0 + 1;
                }
                addr = *(rfc5444_writer_address **)addr;
                iStack_2cc = iStack_2cc + 1;
                tlvtype = (rfc5444_writer_tlvtype *)pprVar9;
              }
            }
            else {
              addr = *(rfc5444_writer_address **)addr;
            }
          }
          if (tlvtype != (rfc5444_writer_tlvtype *)0x0) {
            _close_addrblock((_rfc5444_internal_addr_compress_session *)&best_head,prStack_b0,
                             (rfc5444_writer_address *)tlvtype,0);
            _finalize_message_fragment
                      (prStack_b0,local_478,(list_entity *)&processor,max_msg_size._6_1_,useIf,param
                      );
          }
          _rfc5444_writer_free_addresses(prStack_b0,local_478);
          prStack_b0->_state = RFC5444_WRITER_NONE;
          prStack_b0->msg_addr_len = '\0';
          writer_local._4_4_ = RFC5444_OKAY;
        }
      }
      else {
        prStack_b0->_state = RFC5444_WRITER_NONE;
        prStack_b0->msg_addr_len = '\0';
        writer_local._4_4_ = RFC5444_OKAY;
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

enum rfc5444_result
rfc5444_writer_create_message(
  struct rfc5444_writer *writer, uint8_t msgid, uint8_t addr_len, rfc5444_writer_targetselector useIf, void *param)
{
  struct rfc5444_writer_message *msg;
  struct rfc5444_writer_content_provider *prv;
  struct list_entity *ptr1;
  struct rfc5444_writer_address *addr;
  struct rfc5444_writer_address *first_addr;
  struct rfc5444_writer_address *first_processed, *last_processed;
  struct rfc5444_writer_tlvtype *tlvtype;
  struct rfc5444_writer_target *target;
  struct list_entity current_list;

  struct rfc5444_writer_postprocessor *processor;
  size_t processor_preallocation;

  struct _rfc5444_internal_addr_compress_session acs[RFC5444_MAX_ADDRLEN];
  int best_size, best_head, same_prefixlen;
  int i, idx, non_mandatory;
  bool first;
  bool not_fragmented;
  size_t max_msg_size;
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  /* do nothing if no target is defined */
  if (list_is_empty(&writer->_targets)) {
    return RFC5444_OKAY;
  }

  /* find message create instance for the requested message */
  msg = avl_find_element(&writer->_msgcreators, &msgid, msg, _msgcreator_node);
  if (msg == NULL) {
    /* error, no msgcreator found */
    return RFC5444_NO_MSGCREATOR;
  }

  /*
   * test if we need target specific messages
   * and this is not the single_if selector
   */
  if (!msg->target_specific) {
    /* not target specific */
    writer->msg_target = NULL;
  }
  else if (useIf == rfc5444_writer_singletarget_selector) {
    /* target specific, but single_if selector is used */
    writer->msg_target = param;
  }
  else {
    /* target specific, but generic selector is used */
    enum rfc5444_result result;

    list_for_each_element(&writer->_targets, target, _target_node) {
      /* check if we should send over this target */
      if (!useIf(writer, target, param)) {
        continue;
      }

      /* create an unique message by recursive call */
      result = rfc5444_writer_create_message(writer, msgid, addr_len, rfc5444_writer_singletarget_selector, target);
      if (result != RFC5444_OKAY) {
        return result;
      }
    }
    return RFC5444_OKAY;
  }

  /* set address length */
  writer->msg_addr_len = addr_len;

  /*
   * initialize packet buffers for all interfaces if necessary
   * and calculate message MTU
   */

  /* loop over post-processors */
  processor_preallocation = 0;
  avl_for_each_element(&writer->_processors, processor, _node) {
    if (processor->is_matching_signature(processor, msg->type)) {
      processor_preallocation += processor->allocate_space;
    }
  }
  max_msg_size = writer->msg_size;
  list_for_each_element(&writer->_targets, target, _target_node) {
    size_t interface_msg_mtu;

    /* check if we should send over this target */
    if (!useIf(writer, target, param)) {
      continue;
    }

    /* start packet if necessary */
    if (target->_is_flushed) {
      _rfc5444_writer_begin_packet(writer, target);
    }

    interface_msg_mtu = target->packet_size - processor_preallocation -
                        (target->_pkt.header + target->_pkt.added + target->_pkt.allocated);
    if (interface_msg_mtu < max_msg_size) {
      max_msg_size = interface_msg_mtu;
    }
  }

  /* initialize message tlvdata */
  _rfc5444_tlv_writer_init(&writer->_msg, max_msg_size, writer->msg_size);

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_ADD_HEADER;
#endif
  /* let the message creator write the message header */
  rfc5444_writer_set_msg_header(writer, msg, false, false, false, false);
  if (msg->addMessageHeader) {
    if (msg->addMessageHeader(writer, msg)) {
      /* message handler does not want this message */
#if WRITER_STATE_MACHINE == true
      writer->_state = RFC5444_WRITER_NONE;
#endif
      writer->msg_addr_len = 0;
      return RFC5444_OKAY;
    }
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_ADD_MSGTLV;
#endif

  /* call content providers for message TLVs */
  avl_for_each_element(&msg->_provider_tree, prv, _provider_node) {
    if (prv->addMessageTLVs) {
      prv->addMessageTLVs(writer);
    }
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_ADD_ADDRESSES;
#endif
  /* call content providers for addresses */
  avl_for_each_element(&msg->_provider_tree, prv, _provider_node) {
    if (prv->addAddresses) {
      prv->addAddresses(writer);
    }
  }

  /* join mandatory and normal address list */
  list_merge(&msg->_addr_head, &msg->_non_mandatory_addr_head);

  /* initialize list of current addresses */
  list_init_head(&current_list);
  not_fragmented = true;

  /* no addresses ? */
  if (list_is_empty(&msg->_addr_head)) {
    _finalize_message_fragment(writer, msg, &current_list, true, useIf, param);
#if WRITER_STATE_MACHINE == true
    writer->_state = RFC5444_WRITER_NONE;
#endif
    _rfc5444_writer_free_addresses(writer, msg);
    return RFC5444_OKAY;
  }

  /* start address compression */
  first = true;
  addr = first_addr = list_first_element(&msg->_addr_head, addr, _addr_list_node);

  same_prefixlen = 0;

  first_processed = NULL;
  last_processed = NULL;

  max_msg_size -= writer->_msg.header;
  max_msg_size -= writer->_msg.allocated;
  max_msg_size -= writer->_msg.added;

  /* loop through addresses */
  idx = 0;
  non_mandatory = 0;
  ptr1 = msg->_addr_head.next;
  while (ptr1 != &msg->_addr_head) {
    addr = container_of(ptr1, struct rfc5444_writer_address, _addr_list_node);
    if (addr->_done && !addr->_mandatory_addr) {
      ptr1 = ptr1->next;
      continue;
    }

    if (first) {
      /* clear message specific tlvtype information for address compression */
      list_for_each_element(&msg->_msgspecific_tlvtype_head, tlvtype, _tlvtype_node) {
        memset(tlvtype->_tlvblock_count, 0, sizeof(tlvtype->_tlvblock_count));
        memset(tlvtype->_tlvblock_multi, 0, sizeof(tlvtype->_tlvblock_multi));
      }

      /* clear generic tlvtype information for address compression */
      list_for_each_element(&writer->_addr_tlvtype_head, tlvtype, _tlvtype_node) {
        memset(tlvtype->_tlvblock_count, 0, sizeof(tlvtype->_tlvblock_count));
        memset(tlvtype->_tlvblock_multi, 0, sizeof(tlvtype->_tlvblock_multi));
      }

      /* clear address compression session */
      memset(acs, 0, sizeof(acs));
      same_prefixlen = 1;

      first_processed = addr;
    }

    addr->index = idx++;
    list_add_tail(&current_list, &addr->_addr_fragment_node);

    /* update session with address */
    same_prefixlen = _compress_address(acs, writer, &current_list, same_prefixlen);
    first = false;

    /* look for best current compression */
    best_head = -1;
    best_size = max_msg_size + 1;
    for (i = 0; i < writer->msg_addr_len; i++) {
      int size = acs[i].total + acs[i].current;
      int count = addr->index - acs[i].ptr->index;

      /* a block of 255 addresses have an index difference of 254 */
      if (size < best_size && count <= 254) {
        best_head = i;
        best_size = size;
      }
    }

    /* fragmentation necessary ? */
    if (best_head == -1) {
      if (non_mandatory == 0) {
        /* the mandatory addresses plus one non-mandatory do not fit into a block! */
#if WRITER_STATE_MACHINE == true
        writer->_state = RFC5444_WRITER_NONE;
#endif
        _rfc5444_writer_free_addresses(writer, msg);
        return RFC5444_MTU_TOO_SMALL;
      }
      not_fragmented = false;

      /* one address too many */
      list_remove(&addr->_addr_fragment_node);

      _close_addrblock(acs, writer, last_processed, 0);
#ifdef DEBUG_OUTPUT
      printf("Finalize with head length: %d\n", last_processed->_block_headlen);
#endif
      /* write message fragment */
      _finalize_message_fragment(writer, msg, &current_list, not_fragmented, useIf, param);

      /* reset loop */
      list_init_head(&current_list);
      ptr1 = &first_processed->_addr_list_node;
      first = true;

      /* continue without stepping forward */
      continue;
    }
    else {
      /* add cost for this address to total costs */
      for (i = 0; i < writer->msg_addr_len; i++) {
        acs[i].total += acs[i].current;

#if DEBUG_CLEANUP == true
        acs[i].current = 0;
#endif
      }
      last_processed = addr;

      if (!addr->_done) {
        addr->_done = true;

        if (!addr->_mandatory_addr) {
          non_mandatory++;
        }
      }
    }

    ptr1 = ptr1->next;
  }

  if (last_processed) {
    _close_addrblock(acs, writer, last_processed, 0);

    /* write message fragment */
    _finalize_message_fragment(writer, msg, &current_list, not_fragmented, useIf, param);
  }

  /* free storage of addresses and address-tlvs */
  _rfc5444_writer_free_addresses(writer, msg);

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_NONE;
#endif
  writer->msg_addr_len = 0;

  return RFC5444_OKAY;
}